

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iuutil::ContainsRegexNeHelper::Assertion<char_const*,char_const*>
          (AssertionResult *__return_storage_ptr__,ContainsRegexNeHelper *this,char *regex_str,
          char *actual_str,char **regex,char **actual)

{
  bool bVar1;
  char **v;
  undefined1 auVar2 [16];
  string local_a8;
  string local_88;
  allocator<char> local_51;
  string local_50 [8];
  string expected_str;
  char **actual_local;
  char **regex_local;
  char *actual_str_local;
  char *regex_str_local;
  
  expected_str.field_2._8_8_ = regex;
  bVar1 = ContainsRegexEqHelper::Compare<char_const*,char_const*>((char **)actual_str,regex);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_50,"Not Contains Regex (",&local_51);
    std::allocator<char>::~allocator(&local_51);
    std::__cxx11::string::operator+=(local_50,(char *)this);
    std::__cxx11::string::operator+=(local_50,")");
    auVar2 = std::__cxx11::string::c_str();
    iutest::PrintToString<char_const*>(&local_88,(iutest *)actual_str,auVar2._8_8_);
    iutest::PrintToString<char_const*>(&local_a8,(iutest *)expected_str.field_2._8_8_,v);
    iutest::internal::EqFailure
              (__return_storage_ptr__,auVar2._0_8_,regex_str,&local_88,&local_a8,false);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string(local_50);
  }
  else {
    iutest::AssertionSuccess();
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ Assertion(const char* regex_str, const char* actual_str
    , const T1& regex, const T2& actual)
{
    if( !ContainsRegexEqHelper::Compare(regex, actual) )
    {
        return ::iutest::AssertionSuccess();
    }
    ::std::string expected_str = "Not Contains Regex (";
    expected_str += regex_str;
    expected_str += ")";

    return ::iutest::internal::EqFailure(expected_str.c_str(), actual_str
        , ::iutest::PrintToString(regex)
        , ::iutest::PrintToString(actual)
        , false);
}